

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servnotf.cpp
# Opt level: O3

void __thiscall icu_63::ICUNotifier::notifyChanged(ICUNotifier *this)

{
  int iVar1;
  void *pvVar2;
  int index;
  
  if (this->listeners != (UVector *)0x0) {
    umtx_lock_63((UMutex *)notifyLock);
    if ((this->listeners != (UVector *)0x0) && (iVar1 = this->listeners->count, 0 < iVar1)) {
      index = 0;
      do {
        pvVar2 = UVector::elementAt(this->listeners,index);
        (*this->_vptr_ICUNotifier[6])(this,pvVar2);
        index = index + 1;
      } while (iVar1 != index);
    }
    umtx_unlock_63((UMutex *)notifyLock);
  }
  return;
}

Assistant:

void 
ICUNotifier::notifyChanged(void) 
{
    if (listeners != NULL) {
        Mutex lmx(&notifyLock);
        if (listeners != NULL) {
            for (int i = 0, e = listeners->size(); i < e; ++i) {
                EventListener* el = (EventListener*)listeners->elementAt(i);
                notifyListener(*el);
            }
        }
    }
}